

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleBase.hpp
# Opt level: O2

TestCaseGroup *
vkt::pipeline::
makeMSGroup<vkt::pipeline::multisample::MSCase<vkt::pipeline::multisample::MSCaseSamplePosCorrectness>>
          (TestContext *testCtx,string *groupName,UVec3 *imageSizes,deUint32 imageSizesElemCount,
          VkSampleCountFlagBits *imageSamples,deUint32 imageSamplesElemCount)

{
  TestCaseGroup *pTVar1;
  ostream *poVar2;
  MultisampleCaseBase *node;
  ulong uVar3;
  ulong uVar4;
  VkSampleCountFlagBits samples;
  UVec3 imageSize;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> sizeGroup;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> caseGroup;
  ImageMSParams imageMSParams;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8;
  ostringstream imageSizeStream;
  
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar1,testCtx,(groupName->_M_dataplus)._M_p,"");
  caseGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
       = pTVar1;
  for (uVar4 = 0;
      pTVar1 = caseGroup.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr, uVar4 != imageSizesElemCount; uVar4 = uVar4 + 1) {
    tcu::Vector<unsigned_int,_3>::Vector(&imageSize,imageSizes + uVar4);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&imageSizeStream);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&imageSizeStream);
    poVar2 = std::operator<<(poVar2,"_");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,"_");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    pTVar1 = (TestCaseGroup *)operator_new(0x70);
    std::__cxx11::stringbuf::str();
    tcu::TestCaseGroup::TestCaseGroup(pTVar1,testCtx,local_1e8._M_dataplus._M_p,"");
    sizeGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
    ptr = pTVar1;
    std::__cxx11::string::~string((string *)&local_1e8);
    for (uVar3 = 0;
        pTVar1 = sizeGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr, imageSamplesElemCount != uVar3; uVar3 = uVar3 + 1) {
      samples = imageSamples[uVar3];
      imageMSParams.numSamples = samples;
      tcu::Vector<unsigned_int,_3>::Vector(&imageMSParams.imageSize,&imageSize);
      pTVar1 = sizeGroup.
               super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
               ptr;
      de::toString<vk::VkSampleCountFlagBits>(&local_1c8,&samples);
      std::operator+(&local_1e8,"samples_",&local_1c8);
      node = multisample::MSCase<vkt::pipeline::multisample::MSCaseSamplePosCorrectness>::createCase
                       (testCtx,&local_1e8,&imageMSParams);
      tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)node);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_1c8);
    }
    sizeGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
    ptr = (TestCaseGroup *)0x0;
    tcu::TestNode::addChild
              (&(caseGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                 m_data.ptr)->super_TestNode,&pTVar1->super_TestNode);
    de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
    ~UniqueBase(&sizeGroup.
                 super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&imageSizeStream);
  }
  caseGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr
       = (TestCaseGroup *)0x0;
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&caseGroup.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return pTVar1;
}

Assistant:

tcu::TestCaseGroup* makeMSGroup	(tcu::TestContext&							testCtx,
								 const std::string							groupName,
								 const tcu::UVec3							imageSizes[],
								 const deUint32								imageSizesElemCount,
								 const vk::VkSampleCountFlagBits			imageSamples[],
								 const deUint32								imageSamplesElemCount)
{
	de::MovePtr<tcu::TestCaseGroup> caseGroup(new tcu::TestCaseGroup(testCtx, groupName.c_str(), ""));

	for (deUint32 imageSizeNdx = 0u; imageSizeNdx < imageSizesElemCount; ++imageSizeNdx)
	{
		const tcu::UVec3	imageSize = imageSizes[imageSizeNdx];
		std::ostringstream	imageSizeStream;

		imageSizeStream << imageSize.x() << "_" << imageSize.y() << "_" << imageSize.z();

		de::MovePtr<tcu::TestCaseGroup> sizeGroup(new tcu::TestCaseGroup(testCtx, imageSizeStream.str().c_str(), ""));

		for (deUint32 imageSamplesNdx = 0u; imageSamplesNdx < imageSamplesElemCount; ++imageSamplesNdx)
		{
			const vk::VkSampleCountFlagBits		samples = imageSamples[imageSamplesNdx];
			const multisample::ImageMSParams	imageMSParams = multisample::ImageMSParams(samples, imageSize);

			sizeGroup->addChild(CaseClass::createCase(testCtx, "samples_" + de::toString(samples), imageMSParams));
		}

		caseGroup->addChild(sizeGroup.release());
	}
	return caseGroup.release();
}